

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

bool __thiscall DListMenu::MouseEvent(DListMenu *this,int type,int x,int y)

{
  int iVar1;
  uint x_00;
  uint uVar2;
  FListMenuItem **ppFVar3;
  uint y_00;
  uint local_2c;
  uint i;
  int sel;
  int y_local;
  int x_local;
  int type_local;
  DListMenu *this_local;
  
  iVar1 = DCanvas::GetWidth((DCanvas *)screen);
  x_00 = (x - iVar1 / 2) / CleanXfac + 0xa0;
  iVar1 = DCanvas::GetHeight((DCanvas *)screen);
  y_00 = (y - iVar1 / 2) / CleanYfac + 100;
  if (this->mFocusControl == (FListMenuItem *)0x0) {
    if (((this->mDesc->mWLeft < 1) || (this->mDesc->mWLeft < (int)x_00)) &&
       ((this->mDesc->mWRight < 1 || ((int)x_00 < this->mDesc->mWRight)))) {
      for (local_2c = 0;
          uVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                            (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>),
          local_2c < uVar2; local_2c = local_2c + 1) {
        ppFVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                            (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                             (ulong)local_2c);
        uVar2 = (*(*ppFVar3)->_vptr_FListMenuItem[2])(*ppFVar3,(ulong)x_00,(ulong)y_00);
        if ((uVar2 & 1) != 0) {
          this->mDesc->mSelectedItem = local_2c;
          ppFVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                              (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>
                               ,(ulong)local_2c);
          (*(*ppFVar3)->_vptr_FListMenuItem[0xe])
                    (*ppFVar3,(ulong)(uint)type,(ulong)x_00,(ulong)y_00);
          return true;
        }
      }
    }
    this->mDesc->mSelectedItem = -1;
    this_local._7_1_ = DMenu::MouseEvent(&this->super_DMenu,type,x_00,y_00);
  }
  else {
    (*this->mFocusControl->_vptr_FListMenuItem[0xe])
              (this->mFocusControl,(ulong)(uint)type,(ulong)x_00,(ulong)y_00);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DListMenu::MouseEvent(int type, int x, int y)
{
	int sel = -1;

	// convert x/y from screen to virtual coordinates, according to CleanX/Yfac use in DrawTexture
	x = ((x - (screen->GetWidth() / 2)) / CleanXfac) + 160;
	y = ((y - (screen->GetHeight() / 2)) / CleanYfac) + 100;

	if (mFocusControl != NULL)
	{
		mFocusControl->MouseEvent(type, x, y);
		return true;
	}
	else
	{
		if ((mDesc->mWLeft <= 0 || x > mDesc->mWLeft) &&
			(mDesc->mWRight <= 0 || x < mDesc->mWRight))
		{
			for(unsigned i=0;i<mDesc->mItems.Size(); i++)
			{
				if (mDesc->mItems[i]->CheckCoordinate(x, y))
				{
					if ((int)i != mDesc->mSelectedItem)
					{
						//S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
					}
					mDesc->mSelectedItem = i;
					mDesc->mItems[i]->MouseEvent(type, x, y);
					return true;
				}
			}
		}
	}
	mDesc->mSelectedItem = -1;
	return Super::MouseEvent(type, x, y);
}